

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::cftmdl2(int n,double *a,double *w)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  
  uVar6 = n >> 3;
  dVar20 = w[1];
  iVar1 = uVar6 * 4 + 1;
  dVar21 = *a - a[iVar1];
  lVar7 = (long)(int)(uVar6 * 4);
  dVar22 = a[1] + a[lVar7];
  dVar18 = *a + a[iVar1];
  dVar17 = a[1] - a[lVar7];
  lVar3 = (long)(int)(uVar6 * 2);
  iVar9 = uVar6 * 6 + 1;
  dVar27 = a[lVar3] - a[iVar9];
  iVar2 = uVar6 * 2 + 1;
  dVar28 = a[iVar2] + a[(int)(uVar6 * 6)];
  dVar25 = a[lVar3] + a[iVar9];
  dVar19 = a[iVar2] - a[(int)(uVar6 * 6)];
  dVar26 = (dVar27 - dVar28) * dVar20;
  dVar27 = (dVar28 + dVar27) * dVar20;
  *a = dVar21 + dVar26;
  a[1] = dVar22 + dVar27;
  a[lVar3] = dVar21 - dVar26;
  a[iVar2] = dVar22 - dVar27;
  dVar21 = (dVar25 - dVar19) * dVar20;
  dVar20 = (dVar19 + dVar25) * dVar20;
  a[lVar7] = dVar18 - dVar20;
  a[iVar1] = dVar17 + dVar21;
  a[(int)(uVar6 * 6)] = dVar20 + dVar18;
  a[iVar9] = dVar17 - dVar21;
  if ((int)uVar6 < 3) {
    uVar4 = (ulong)(int)uVar6;
  }
  else {
    uVar4 = (ulong)uVar6;
    pdVar10 = w + lVar7 + -1;
    pdVar11 = w + 7;
    lVar5 = lVar3 << 4;
    lVar16 = lVar3 << 5;
    lVar13 = lVar3 * 0x18;
    lVar7 = lVar3 * 0x18;
    uVar8 = 2;
    lVar12 = lVar3;
    lVar14 = lVar3;
    lVar15 = lVar5;
    do {
      lVar15 = lVar15 + -0x10;
      lVar14 = lVar14 + 2;
      lVar12 = lVar12 + -2;
      lVar16 = lVar16 + -0x10;
      lVar13 = lVar13 + -0x10;
      lVar7 = lVar7 + 0x10;
      lVar5 = lVar5 + 0x10;
      dVar20 = pdVar11[-3];
      dVar17 = pdVar11[-2];
      dVar18 = pdVar11[-1];
      dVar19 = *pdVar11;
      dVar21 = pdVar10[-3];
      dVar22 = pdVar10[-2];
      dVar25 = a[uVar8];
      dVar26 = (a + uVar8)[1];
      dVar27 = *(double *)((long)a + lVar5);
      dVar28 = ((double *)((long)a + lVar5))[1];
      dVar32 = dVar25 + dVar28;
      dVar33 = dVar26 + dVar27;
      dVar23 = a[lVar14];
      dVar24 = (a + lVar14)[1];
      dVar25 = dVar25 - dVar28;
      dVar26 = dVar26 - dVar27;
      dVar27 = *(double *)((long)a + lVar7);
      dVar28 = ((double *)((long)a + lVar7))[1];
      dVar29 = dVar23 + dVar28;
      dVar30 = dVar24 + dVar27;
      dVar23 = dVar23 - dVar28;
      dVar24 = dVar24 - dVar27;
      dVar34 = dVar20 * dVar25 + -dVar17 * dVar33;
      dVar35 = dVar20 * dVar33 + dVar17 * dVar25;
      dVar25 = pdVar10[-1];
      dVar33 = dVar22 * dVar23 + -dVar21 * dVar30;
      dVar30 = dVar22 * dVar30 + dVar21 * dVar23;
      dVar27 = dVar18 * dVar32 + dVar26 * dVar19;
      dVar28 = dVar18 * dVar26 + dVar32 * -dVar19;
      dVar26 = *pdVar10;
      a[uVar8] = dVar34 + dVar33;
      (a + uVar8)[1] = dVar35 + dVar30;
      dVar23 = dVar26 * dVar29 + dVar24 * dVar25;
      dVar24 = dVar26 * dVar24 + dVar29 * -dVar25;
      a[lVar14] = dVar34 - dVar33;
      (a + lVar14)[1] = dVar35 - dVar30;
      *(double *)((long)a + lVar5) = dVar27 + dVar23;
      ((double *)((long)a + lVar5))[1] = dVar28 + dVar24;
      *(double *)((long)a + lVar7) = dVar27 - dVar23;
      ((double *)((long)a + lVar7))[1] = dVar28 - dVar24;
      dVar27 = a[lVar12];
      dVar28 = (a + lVar12)[1];
      dVar23 = *(double *)((long)a + lVar13);
      dVar24 = ((double *)((long)a + lVar13))[1];
      dVar35 = dVar27 + dVar24;
      dVar31 = dVar28 + dVar23;
      dVar33 = *(double *)((long)a + lVar15);
      dVar30 = ((double *)((long)a + lVar15))[1];
      dVar29 = *(double *)((long)a + lVar16);
      dVar32 = ((double *)((long)a + lVar16))[1];
      dVar27 = dVar27 - dVar24;
      dVar28 = dVar28 - dVar23;
      dVar34 = dVar33 + dVar32;
      dVar24 = dVar30 + dVar29;
      dVar33 = dVar33 - dVar32;
      dVar30 = dVar30 - dVar29;
      dVar23 = dVar21 * dVar27 + -dVar22 * dVar31;
      dVar21 = dVar21 * dVar31 + dVar22 * dVar27;
      dVar22 = dVar17 * dVar33 + -dVar20 * dVar24;
      dVar27 = dVar17 * dVar24 + dVar20 * dVar33;
      dVar24 = dVar25 * dVar35 + dVar28 * dVar26;
      dVar25 = dVar25 * dVar28 + dVar35 * -dVar26;
      a[lVar12] = dVar23 + dVar22;
      (a + lVar12)[1] = dVar21 + dVar27;
      dVar20 = dVar19 * dVar34 + dVar30 * dVar18;
      dVar17 = dVar19 * dVar30 + dVar34 * -dVar18;
      *(double *)((long)a + lVar15) = dVar23 - dVar22;
      ((double *)((long)a + lVar15))[1] = dVar21 - dVar27;
      *(double *)((long)a + lVar13) = dVar24 + dVar20;
      ((double *)((long)a + lVar13))[1] = dVar25 + dVar17;
      *(double *)((long)a + lVar16) = dVar24 - dVar20;
      ((double *)((long)a + lVar16))[1] = dVar25 - dVar17;
      pdVar10 = pdVar10 + -4;
      pdVar11 = pdVar11 + 4;
      uVar8 = uVar8 + 2;
    } while (uVar8 < uVar4);
  }
  dVar20 = w[iVar2];
  dVar17 = w[lVar3];
  dVar18 = a[uVar4];
  dVar19 = (a + uVar4)[1];
  dVar21 = a[(int)(uVar6 * 5)];
  dVar22 = (a + (int)(uVar6 * 5))[1];
  dVar27 = dVar18 + dVar22;
  dVar28 = dVar19 + dVar21;
  dVar18 = dVar18 - dVar22;
  dVar19 = dVar19 - dVar21;
  dVar21 = a[(int)(uVar6 * 3)];
  dVar22 = (a + (int)(uVar6 * 3))[1];
  dVar25 = a[(int)(uVar6 * 7)];
  dVar26 = (a + (int)(uVar6 * 7))[1];
  dVar23 = dVar21 + dVar26;
  dVar24 = dVar22 + dVar25;
  dVar21 = dVar21 - dVar26;
  dVar22 = dVar22 - dVar25;
  dVar25 = dVar18 * dVar17 + dVar28 * -dVar20;
  dVar18 = dVar28 * dVar17 + dVar18 * dVar20;
  dVar26 = dVar21 * dVar20 + dVar24 * -dVar17;
  dVar21 = dVar24 * dVar20 + dVar21 * dVar17;
  a[uVar4] = dVar25 + dVar26;
  (a + uVar4)[1] = dVar18 + dVar21;
  a[(int)(uVar6 * 3)] = dVar25 - dVar26;
  (a + (int)(uVar6 * 3))[1] = dVar18 - dVar21;
  dVar18 = dVar20 * dVar27 + dVar19 * -dVar17;
  dVar19 = dVar20 * dVar19 + dVar27 * dVar17;
  dVar21 = dVar17 * dVar23 + dVar22 * -dVar20;
  dVar20 = dVar17 * dVar22 + dVar23 * dVar20;
  a[(int)(uVar6 * 5)] = dVar18 - dVar21;
  (a + (int)(uVar6 * 5))[1] = dVar19 - dVar20;
  a[(int)(uVar6 * 7)] = dVar21 + dVar18;
  (a + (int)(uVar6 * 7))[1] = dVar20 + dVar19;
  return;
}

Assistant:

void cftmdl2(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, kr, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i, wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i, y0r, y0i, y2r, y2i;

  mh = n >> 3;
  m = 2 * mh;
  wn4r = w[1];
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] - a[j2 + 1];
  x0i = a[1] + a[j2];
  x1r = a[0] + a[j2 + 1];
  x1i = a[1] - a[j2];
  x2r = a[j1] - a[j3 + 1];
  x2i = a[j1 + 1] + a[j3];
  x3r = a[j1] + a[j3 + 1];
  x3i = a[j1 + 1] - a[j3];
  y0r = wn4r * (x2r - x2i);
  y0i = wn4r * (x2i + x2r);
  a[0] = x0r + y0r;
  a[1] = x0i + y0i;
  a[j1] = x0r - y0r;
  a[j1 + 1] = x0i - y0i;
  y0r = wn4r * (x3r - x3i);
  y0i = wn4r * (x3i + x3r);
  a[j2] = x1r - y0i;
  a[j2 + 1] = x1i + y0r;
  a[j3] = x1r + y0i;
  a[j3 + 1] = x1i - y0r;
  k = 0;
  kr = 2 * m;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    kr -= 4;
    wd1i = w[kr];
    wd1r = w[kr + 1];
    wd3i = w[kr + 2];
    wd3r = w[kr + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] - a[j2 + 1];
    x0i = a[j + 1] + a[j2];
    x1r = a[j] + a[j2 + 1];
    x1i = a[j + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wk1r * x0r - wk1i * x0i;
    y0i = wk1r * x0i + wk1i * x0r;
    y2r = wd1r * x2r - wd1i * x2i;
    y2i = wd1r * x2i + wd1i * x2r;
    a[j] = y0r + y2r;
    a[j + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wk3r * x1r + wk3i * x1i;
    y0i = wk3r * x1i - wk3i * x1r;
    y2r = wd3r * x3r + wd3i * x3i;
    y2i = wd3r * x3i - wd3i * x3r;
    a[j2] = y0r + y2r;
    a[j2 + 1] = y0i + y2i;
    a[j3] = y0r - y2r;
    a[j3 + 1] = y0i - y2i;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] - a[j2 + 1];
    x0i = a[j0 + 1] + a[j2];
    x1r = a[j0] + a[j2 + 1];
    x1i = a[j0 + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wd1i * x0r - wd1r * x0i;
    y0i = wd1i * x0i + wd1r * x0r;
    y2r = wk1i * x2r - wk1r * x2i;
    y2i = wk1i * x2i + wk1r * x2r;
    a[j0] = y0r + y2r;
    a[j0 + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wd3i * x1r + wd3r * x1i;
    y0i = wd3i * x1i - wd3r * x1r;
    y2r = wk3i * x3r + wk3r * x3i;
    y2i = wk3i * x3i - wk3r * x3r;
    a[j2] = y0r + y2r;
    a[j2 + 1] = y0i + y2i;
    a[j3] = y0r - y2r;
    a[j3 + 1] = y0i - y2i;
  }
  wk1r = w[m];
  wk1i = w[m + 1];
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] - a[j2 + 1];
  x0i = a[j0 + 1] + a[j2];
  x1r = a[j0] + a[j2 + 1];
  x1i = a[j0 + 1] - a[j2];
  x2r = a[j1] - a[j3 + 1];
  x2i = a[j1 + 1] + a[j3];
  x3r = a[j1] + a[j3 + 1];
  x3i = a[j1 + 1] - a[j3];
  y0r = wk1r * x0r - wk1i * x0i;
  y0i = wk1r * x0i + wk1i * x0r;
  y2r = wk1i * x2r - wk1r * x2i;
  y2i = wk1i * x2i + wk1r * x2r;
  a[j0] = y0r + y2r;
  a[j0 + 1] = y0i + y2i;
  a[j1] = y0r - y2r;
  a[j1 + 1] = y0i - y2i;
  y0r = wk1i * x1r - wk1r * x1i;
  y0i = wk1i * x1i + wk1r * x1r;
  y2r = wk1r * x3r - wk1i * x3i;
  y2i = wk1r * x3i + wk1i * x3r;
  a[j2] = y0r - y2r;
  a[j2 + 1] = y0i - y2i;
  a[j3] = y0r + y2r;
  a[j3 + 1] = y0i + y2i;
}